

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult vmaFlushAllocations(VmaAllocator allocator,uint32_t allocationCount,
                            VmaAllocation *allocations,VkDeviceSize *offsets,VkDeviceSize *sizes)

{
  VkResult VVar1;
  
  if (allocationCount != 0) {
    VVar1 = VmaAllocator_T::FlushOrInvalidateAllocations
                      (allocator,allocationCount,allocations,offsets,sizes,VMA_CACHE_FLUSH);
    return VVar1;
  }
  return VK_SUCCESS;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaFlushAllocations(
    VmaAllocator allocator,
    uint32_t allocationCount,
    const VmaAllocation* allocations,
    const VkDeviceSize* offsets,
    const VkDeviceSize* sizes)
{
    VMA_ASSERT(allocator);

    if(allocationCount == 0)
    {
        return VK_SUCCESS;
    }

    VMA_ASSERT(allocations);

    VMA_DEBUG_LOG("vmaFlushAllocations");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    const VkResult res = allocator->FlushOrInvalidateAllocations(allocationCount, allocations, offsets, sizes, VMA_CACHE_FLUSH);

    return res;
}